

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O1

size_t __thiscall
CoreML::Specification::MILSpec::Argument_Binding::ByteSizeLong(Argument_Binding *this)

{
  uint32_t uVar1;
  ulong uVar2;
  int iVar3;
  undefined8 *puVar4;
  size_t sVar5;
  uint uVar6;
  
  uVar1 = this->_oneof_case_[0];
  if (uVar1 == 2) {
    sVar5 = Value::ByteSizeLong((this->binding_).value_);
  }
  else {
    if (uVar1 != 1) {
      sVar5 = 0;
      goto LAB_00226760;
    }
    if (uVar1 == 1) {
      puVar4 = (undefined8 *)((ulong)(this->binding_).value_ & 0xfffffffffffffffe);
    }
    else {
      puVar4 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    sVar5 = puVar4[1];
  }
  uVar6 = (uint)sVar5 | 1;
  iVar3 = 0x1f;
  if (uVar6 != 0) {
    for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
    }
  }
  sVar5 = sVar5 + (iVar3 * 9 + 0x49U >> 6) + 1;
LAB_00226760:
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    sVar5 = sVar5 + *(long *)((uVar2 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar5;
  return sVar5;
}

Assistant:

size_t Argument_Binding::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.MILSpec.Argument.Binding)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  switch (binding_case()) {
    // string name = 1;
    case kName: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_name());
      break;
    }
    // .CoreML.Specification.MILSpec.Value value = 2;
    case kValue: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *binding_.value_);
      break;
    }
    case BINDING_NOT_SET: {
      break;
    }
  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}